

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O3

ArrayRef<int> * __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::InitialValuesSparsity
          (BasicProblem<mp::BasicProblemParams<int>_> *this)

{
  int *piVar1;
  ArrayRef<int> *in_RDI;
  
  (in_RDI->save_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (in_RDI->save_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (in_RDI->save_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  piVar1 = (this->iv_set_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  in_RDI->data_ = piVar1;
  in_RDI->size_ =
       (long)(this->iv_set_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)piVar1 >> 2;
  return in_RDI;
}

Assistant:

ArrayRef<int> InitialValuesSparsity() const { return iv_set_; }